

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_bKGD(ucvector *out,LodePNGInfo *info)

{
  undefined1 local_38 [8];
  ucvector bKGD;
  uint error;
  LodePNGInfo *info_local;
  ucvector *out_local;
  
  bKGD.allocsize._4_4_ = 0;
  ucvector_init((ucvector *)local_38);
  if (((info->color).colortype == LCT_GREY) || ((info->color).colortype == LCT_GREY_ALPHA)) {
    ucvector_push_back((ucvector *)local_38,(uchar)(info->background_r >> 8));
    ucvector_push_back((ucvector *)local_38,(uchar)info->background_r);
  }
  else if (((info->color).colortype == LCT_RGB) || ((info->color).colortype == LCT_RGBA)) {
    ucvector_push_back((ucvector *)local_38,(uchar)(info->background_r >> 8));
    ucvector_push_back((ucvector *)local_38,(uchar)info->background_r);
    ucvector_push_back((ucvector *)local_38,(uchar)(info->background_g >> 8));
    ucvector_push_back((ucvector *)local_38,(uchar)info->background_g);
    ucvector_push_back((ucvector *)local_38,(uchar)(info->background_b >> 8));
    ucvector_push_back((ucvector *)local_38,(uchar)info->background_b);
  }
  else if ((info->color).colortype == LCT_PALETTE) {
    ucvector_push_back((ucvector *)local_38,(uchar)info->background_r);
  }
  bKGD.allocsize._4_4_ = addChunk(out,"bKGD",(uchar *)local_38,(size_t)bKGD.data);
  ucvector_cleanup(local_38);
  return bKGD.allocsize._4_4_;
}

Assistant:

static unsigned addChunk_bKGD(ucvector* out, const LodePNGInfo* info)
{
  unsigned error = 0;
  ucvector bKGD;
  ucvector_init(&bKGD);
  if(info->color.colortype == LCT_GREY || info->color.colortype == LCT_GREY_ALPHA)
  {
    ucvector_push_back(&bKGD, (unsigned char)(info->background_r / 256));
    ucvector_push_back(&bKGD, (unsigned char)(info->background_r % 256));
  }
  else if(info->color.colortype == LCT_RGB || info->color.colortype == LCT_RGBA)
  {
    ucvector_push_back(&bKGD, (unsigned char)(info->background_r / 256));
    ucvector_push_back(&bKGD, (unsigned char)(info->background_r % 256));
    ucvector_push_back(&bKGD, (unsigned char)(info->background_g / 256));
    ucvector_push_back(&bKGD, (unsigned char)(info->background_g % 256));
    ucvector_push_back(&bKGD, (unsigned char)(info->background_b / 256));
    ucvector_push_back(&bKGD, (unsigned char)(info->background_b % 256));
  }
  else if(info->color.colortype == LCT_PALETTE)
  {
    ucvector_push_back(&bKGD, (unsigned char)(info->background_r % 256)); /*palette index*/
  }

  error = addChunk(out, "bKGD", bKGD.data, bKGD.size);
  ucvector_cleanup(&bKGD);

  return error;
}